

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

ON_MeshComponentRef * __thiscall ON_Mesh::MeshComponent(ON_Mesh *this,ON_COMPONENT_INDEX ci)

{
  ON_Mesh *pOVar1;
  ON_COMPONENT_INDEX OVar2;
  bool local_5d;
  ON_COMPONENT_INDEX local_50;
  ON_COMPONENT_INDEX local_48;
  undefined1 local_40 [8];
  ON_MeshComponentRef cr;
  ON_MeshComponentRef *cr_ptr;
  ON_Mesh *this_local;
  ON_COMPONENT_INDEX ci_local;
  
  cr.m_mesh_ci.m_type = invalid_type;
  cr.m_mesh_ci.m_index = 0;
  local_48 = ci;
  this_local = (ON_Mesh *)ci;
  MeshComponentRef((ON_MeshComponentRef *)local_40,this,ci);
  pOVar1 = ON_MeshComponentRef::Mesh((ON_MeshComponentRef *)local_40);
  local_5d = false;
  if (this == pOVar1) {
    local_50 = ON_MeshComponentRef::ComponentIndex((ON_MeshComponentRef *)local_40);
    local_5d = ON_COMPONENT_INDEX::operator==(&local_50,(ON_COMPONENT_INDEX *)&this_local);
  }
  if (local_5d != false) {
    OVar2 = (ON_COMPONENT_INDEX)operator_new(0x20);
    ON_MeshComponentRef::ON_MeshComponentRef
              ((ON_MeshComponentRef *)OVar2,(ON_MeshComponentRef *)local_40);
    cr.m_mesh_ci = OVar2;
  }
  OVar2 = cr.m_mesh_ci;
  ON_MeshComponentRef::~ON_MeshComponentRef((ON_MeshComponentRef *)local_40);
  return (ON_MeshComponentRef *)OVar2;
}

Assistant:

ON_MeshComponentRef* ON_Mesh::MeshComponent( 
  ON_COMPONENT_INDEX ci
  ) const
{
  ON_MeshComponentRef* cr_ptr = 0;
  ON_MeshComponentRef cr = MeshComponentRef(ci);
  if ( this == cr.Mesh() && cr.ComponentIndex() == ci )
    cr_ptr = new ON_MeshComponentRef(cr);
  return cr_ptr;
}